

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O0

char * stbds_strdup(char *str)

{
  size_t sVar1;
  char *__dest;
  char *p;
  size_t len;
  char *str_local;
  
  sVar1 = strlen(str);
  __dest = (char *)realloc((void *)0x0,sVar1 + 1);
  memmove(__dest,str,sVar1 + 1);
  return __dest;
}

Assistant:

static char *stbds_strdup(char *str)
{
  // to keep replaceable allocator simple, we don't want to use strdup.
  // rolling our own also avoids problem of strdup vs _strdup
  size_t len = strlen(str)+1;
  char *p = (char*) STBDS_REALLOC(NULL, 0, len);
  memmove(p, str, len);
  return p;
}